

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O1

void uset_removeString_63(USet *set,UChar *str,int32_t strLen)

{
  UnicodeString s;
  ConstChar16Ptr local_60;
  UChar *local_58;
  UnicodeString local_48;
  
  local_60.p_ = str;
  icu_63::UnicodeString::UnicodeString(&local_48,strLen == -1,&local_60,strLen);
  local_58 = local_60.p_;
  icu_63::UnicodeSet::remove((UnicodeSet *)set,(char *)&local_48);
  icu_63::UnicodeString::~UnicodeString(&local_48);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uset_removeString(USet* set, const UChar* str, int32_t strLen) {
    UnicodeString s(strLen==-1, str, strLen);
    ((UnicodeSet*) set)->UnicodeSet::remove(s);
}